

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O0

void __thiscall HPreData::makeACopy(HPreData *this)

{
  int iVar1;
  size_type __new_size;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  int iPut;
  int iColumn;
  int iRow;
  int k_1;
  int AcountX;
  vector<int,_std::allocator<int>_> iwork;
  int k;
  int i;
  size_type in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  value_type vVar5;
  undefined4 in_stack_ffffffffffffff74;
  int iVar6;
  allocator_type *in_stack_ffffffffffffff78;
  value_type vVar7;
  int in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  vector<int,_std::allocator<int>_> *this_00;
  int local_4c;
  int local_48;
  undefined1 local_2d [29];
  int local_10;
  int local_c;
  
  __new_size = (size_type)
               *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_finish + 4);
  local_2d._1_4_ = 0;
  this_00 = (vector<int,_std::allocator<int>_> *)local_2d;
  std::allocator<int>::allocator((allocator<int> *)0x1b7ebc);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (value_type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  std::allocator<int>::~allocator((allocator<int> *)0x1b7ee1);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(value_type *)0x1b7f07);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<double,_std::allocator<double>_>::resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  for (local_48 = 0; local_48 < (int)sVar2; local_48 = local_48 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)local_48);
    if (*pvVar3 < *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish + 4)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)local_48);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_2d + 5),(long)*pvVar3);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  for (local_c = 1;
      local_c <=
      *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_c = local_c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)(local_c + -1));
    vVar5 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_2d + 5),(long)(local_c + -1));
    iVar1 = vVar5 + *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_c);
    *pvVar3 = iVar1;
  }
  for (local_c = 0;
      local_c < *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish + 4);
      local_c = local_c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_c);
    in_stack_ffffffffffffff84 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_2d + 5),(long)local_c);
    *pvVar3 = in_stack_ffffffffffffff84;
  }
  for (local_4c = 0;
      local_4c <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish; local_4c = local_4c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_4c);
    local_10 = *pvVar3;
    while( true ) {
      in_stack_ffffffffffffff80 = local_10;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)(local_4c + 1));
      if (*pvVar3 <= in_stack_ffffffffffffff80) break;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)local_10);
      if (*pvVar3 !=
          *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish + 4)) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_2d + 5),(long)*pvVar3);
        iVar1 = *pvVar3;
        *pvVar3 = iVar1 + 1;
        iVar6 = local_4c;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)iVar1);
        *pvVar3 = iVar6;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDI + 0x10,(long)local_10);
        vVar7 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 3,(long)iVar1);
        *pvVar4 = vVar7;
      }
      local_10 = local_10 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,(value_type *)in_RDI);
  for (local_c = 0;
      local_c < *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish + 4);
      local_c = local_c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)(local_c + 1));
    vVar5 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_c);
    *pvVar3 = vVar5;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return;
}

Assistant:

void HPreData::makeACopy() {
    // Make a A copy

    int i,k;
    vector<int> iwork(numColOriginal, 0);
    Astart.assign(numColOriginal + 1, 0);
    int AcountX = ARindex.size();
    Aindex.resize(AcountX);
    Avalue.resize(AcountX);
    for (int k = 0; k < AcountX; k++)
    	if (ARindex[k] < numColOriginal)
    		iwork[ARindex[k]]++;
    for (i = 1; i <= numColOriginal; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numColOriginal; i++)
        iwork[i] = Astart[i];
    for (int iRow = 0; iRow < numRowOriginal; iRow++) {
        for (k = ARstart[iRow]; k < ARstart[iRow + 1]; k++) {
            int iColumn = ARindex[k];
            if (iColumn != numColOriginal) {
				int iPut = iwork[iColumn]++;
				Aindex[iPut] = iRow;
				Avalue[iPut] = ARvalue[k];
            }
        }
    }

    Aend.resize(numColOriginal + 1, 0);
    for (i = 0; i < numColOriginal; i++)
        Aend[i] = Astart[i + 1];
}